

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  ZeroCopyInputStream *pZVar1;
  char cVar2;
  int iVar3;
  LogMessage *pLVar4;
  int iVar5;
  LogFinisher local_75;
  int buffer_size;
  void *void_buffer;
  LogMessage local_68;
  
  if (*(int *)&this->buffer_end_ != *(int *)&this->buffer_) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/io/coded_stream.cc"
               ,0x1e7);
    pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (0) == (BufferSize()): ");
    internal::LogFinisher::operator=((LogFinisher *)&void_buffer,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    if (this->total_bytes_warning_threshold_ <= this->total_bytes_read_ &&
        -1 < this->total_bytes_warning_threshold_) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/io/coded_stream.cc"
                 ,0x1f9);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_68,
                          "Reading dangerously large protocol message.  If the message turns out to be larger than "
                         );
      pLVar4 = internal::LogMessage::operator<<(pLVar4,this->total_bytes_limit_);
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,
                          " bytes, parsing will be halted for security reasons.  To increase the limit (or to disable these warnings), see CodedInputStream::SetTotalBytesLimit() in google/protobuf/io/coded_stream.h."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&void_buffer,pLVar4);
      internal::LogMessage::~LogMessage(&local_68);
      this->total_bytes_warning_threshold_ = -2;
    }
    pZVar1 = this->input_;
    do {
      iVar3 = (*pZVar1->_vptr_ZeroCopyInputStream[2])(pZVar1,&void_buffer,&buffer_size);
      cVar2 = (char)iVar3;
      if (cVar2 == '\0') {
        this->buffer_ = (uint8 *)0x0;
        this->buffer_end_ = (uint8 *)0x0;
        return false;
      }
    } while ((long)buffer_size == 0);
    this->buffer_ = (uint8 *)void_buffer;
    this->buffer_end_ = (uint8 *)((long)void_buffer + (long)buffer_size);
    if (buffer_size < 0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/io/coded_stream.cc"
                 ,0x20a);
      pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (buffer_size) >= (0): ");
      internal::LogFinisher::operator=(&local_75,pLVar4);
      internal::LogMessage::~LogMessage(&local_68);
    }
    iVar3 = this->total_bytes_read_;
    iVar5 = iVar3 - (buffer_size ^ 0x7fffffffU);
    if (iVar5 == 0 || iVar3 < (int)(buffer_size ^ 0x7fffffffU)) {
      iVar3 = buffer_size + iVar3;
    }
    else {
      this->overflow_bytes_ = iVar5;
      this->buffer_end_ = this->buffer_end_ + -(long)iVar5;
      iVar3 = 0x7fffffff;
    }
    this->total_bytes_read_ = iVar3;
    RecomputeBufferLimits(this);
  }
  else {
    cVar2 = '\0';
    if ((this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_) &&
       (cVar2 = '\0', this->total_bytes_limit_ != this->current_limit_)) {
      PrintTotalBytesLimitError(this);
      cVar2 = '\0';
    }
  }
  return (bool)cVar2;
}

Assistant:

bool CodedInputStream::Refresh() {
  GOOGLE_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  if (total_bytes_warning_threshold_ >= 0 &&
      total_bytes_read_ >= total_bytes_warning_threshold_) {
      GOOGLE_LOG(WARNING) << "Reading dangerously large protocol message.  If the "
                      "message turns out to be larger than "
                   << total_bytes_limit_ << " bytes, parsing will be halted "
                      "for security reasons.  To increase the limit (or to "
                      "disable these warnings), see "
                      "CodedInputStream::SetTotalBytesLimit() in "
                      "google/protobuf/io/coded_stream.h.";

    // Don't warn again for this stream, and print total size at the end.
    total_bytes_warning_threshold_ = -2;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    GOOGLE_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}